

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O0

Solution * ConstructionHeuristics::FirstFit(Solution *solution,string *skillId)

{
  bool bVar1;
  difference_type dVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
  local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
  local_30;
  const_reverse_iterator dayIndex;
  const_reverse_iterator rend;
  const_reverse_iterator rbegin;
  string *skillId_local;
  Solution *solution_local;
  
  Solution::getTurns(solution);
  std::
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  ::rbegin((vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
            *)&rend);
  Solution::getTurns(solution);
  std::
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  ::rend((vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
          *)&dayIndex);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
  ::reverse_iterator(&local_30,&rend);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&dayIndex);
    if (!bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
    ::reverse_iterator(&local_38,&local_30);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
    ::reverse_iterator(&local_40,&dayIndex);
    dVar2 = std::
            distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<Turn*,std::allocator<Turn*>>const*,std::vector<std::vector<Turn*,std::allocator<Turn*>>,std::allocator<std::vector<Turn*,std::allocator<Turn*>>>>>>>
                      (&local_38,&local_40);
    assignGivenDay(solution,(int)dVar2 - 1,skillId);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>_>
    ::operator++(&local_48,(int)&local_30);
  }
  return solution;
}

Assistant:

Solution *ConstructionHeuristics::FirstFit(Solution *solution, const string &skillId) {
    auto rbegin = solution->getTurns().rbegin();
    auto rend = solution->getTurns().rend();

    for (auto dayIndex = rbegin; dayIndex != rend; dayIndex++)
        assignGivenDay(solution, (unsigned int) distance(dayIndex, rend)-1, skillId);

    return solution;
}